

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O1

void __thiscall
AutoArgParse::FlagStore::printUsageHelp(FlagStore *this,ostream *os,IndentedLine *lineIndent)

{
  pointer puVar1;
  ArgBase *pAVar2;
  int iVar3;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  pointer puVar4;
  
  lineIndent->indentLevel = lineIndent->indentLevel + 1;
  puVar1 = (this->args).
           super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->args).
                super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    if (*(size_type *)
         ((long)&(((puVar4->_M_t).
                   super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                   .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->
                 super_ParseToken).description + 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      if (0 < lineIndent->indentLevel) {
        iVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
          iVar3 = iVar3 + 1;
        } while (iVar3 < lineIndent->indentLevel);
      }
      pAVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
               .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(pAVar2->name)._M_dataplus._M_p,(pAVar2->name)._M_string_length);
      if ((((puVar4->_M_t).
            super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
            .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->super_ParseToken).
          policy == OPTIONAL) {
        std::__ostream_insert<char,std::char_traits<char>>(os," [optional]",0xb);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      pAVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
               .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pAVar2->super_ParseToken).description._M_dataplus._M_p,
                 *(size_type *)((long)&(pAVar2->super_ParseToken).description + 8));
    }
  }
  AutoArgParse::printUsageHelp(&this->flagInsertionOrder,&this->flags,os,lineIndent);
  lineIndent->indentLevel = lineIndent->indentLevel + -1;
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::printUsageHelp(
    std::ostream& os, IndentedLine& lineIndent) const {
    lineIndent.indentLevel++;
    for (auto& argPtr : args) {
        if (argPtr->description.size() > 0) {
            os << lineIndent;
            os << argPtr->name;
            if (argPtr->policy == Policy::OPTIONAL) {
                os << " [optional]";
            }
            std::cout << ": " << argPtr->description;
        }
    }
    AutoArgParse::printUsageHelp(flagInsertionOrder, flags, os, lineIndent);
    lineIndent.indentLevel--;
}